

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPHashAlgorithm.cpp
# Opt level: O2

bool __thiscall OSSLEVPHashAlgorithm::hashUpdate(OSSLEVPHashAlgorithm *this,ByteString *data)

{
  EVP_MD_CTX *ctx;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uchar *d;
  ByteString dummy;
  
  bVar1 = HashAlgorithm::hashUpdate(&this->super_HashAlgorithm,data);
  if (bVar1) {
    sVar3 = ByteString::size(data);
    if (sVar3 == 0) {
      return true;
    }
    ctx = (EVP_MD_CTX *)this->curCTX;
    d = ByteString::const_byte_str(data);
    sVar3 = ByteString::size(data);
    iVar2 = EVP_DigestUpdate(ctx,d,sVar3);
    if (iVar2 != 0) {
      return true;
    }
    softHSMLog(3,"hashUpdate",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPHashAlgorithm.cpp"
               ,0x5c,"EVP_DigestUpdate failed");
    EVP_MD_CTX_free(this->curCTX);
    this->curCTX = (EVP_MD_CTX *)0x0;
    ByteString::ByteString(&dummy);
    HashAlgorithm::hashFinal(&this->super_HashAlgorithm,&dummy);
    ByteString::~ByteString(&dummy);
  }
  return false;
}

Assistant:

bool OSSLEVPHashAlgorithm::hashUpdate(const ByteString& data)
{
	if (!HashAlgorithm::hashUpdate(data))
	{
		return false;
	}

	// Continue digesting
	if (data.size() == 0)
	{
		return true;
	}

	if (!EVP_DigestUpdate(curCTX, (unsigned char*) data.const_byte_str(), data.size()))
	{
		ERROR_MSG("EVP_DigestUpdate failed");

		EVP_MD_CTX_free(curCTX);
		curCTX = NULL;

		ByteString dummy;
		HashAlgorithm::hashFinal(dummy);

		return false;
	}

	return true;
}